

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorCircle.cpp
# Opt level: O0

void __thiscall ColorCircle::showUp(ColorCircle *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double y;
  double x;
  double dVar8;
  double dVar9;
  double xx;
  double yy;
  double agl;
  double agl2;
  double agl1;
  double x_hp1;
  double x_hp2;
  double y_hp;
  ColorCircle *this_local;
  
  if (0 < (this->super_Colored).state_) {
    y = ((this->super_Colored).hp_ / (this->super_Colored).hp_max_) * 2.0 * this->r_ + -this->r_;
    x = sqrt(this->r_ * this->r_ + -(y * y));
    yy = Colored::myAtan2(y,-x);
    agl = Colored::myAtan2(y,x);
    if (agl < yy) {
      agl = agl + 360.0;
    }
    iVar7 = (this->super_Colored).rgb_[1];
    glColor3ub((char)(this->super_Colored).rgb_[0],(char)iVar7,(this->super_Colored).rgb_[2] & 0xff,
               iVar7);
    glBegin(9);
    for (; yy <= agl; yy = 360.0 / (double)this->shape_n_ + yy) {
      dVar1 = (this->super_Colored).y_;
      dVar2 = (this->super_Colored).shape_scale_;
      dVar3 = this->r_;
      dVar8 = sin(yy * 0.01745329251993889);
      dVar4 = (this->super_Colored).x_;
      dVar5 = (this->super_Colored).shape_scale_;
      dVar6 = this->r_;
      dVar9 = cos(yy * 0.01745329251993889);
      Colored::myglVertex2d
                (&this->super_Colored,dVar5 * dVar6 * dVar9 + dVar4,dVar2 * dVar3 * dVar8 + dVar1);
    }
    Colored::myglVertex2d
              (&this->super_Colored,
               (this->super_Colored).shape_scale_ * x + (this->super_Colored).x_,
               (this->super_Colored).shape_scale_ * y + (this->super_Colored).y_);
    glEnd();
    glColor3ub(0,0);
    dVar1 = (this->super_Colored).line_width_;
    glLineWidth(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1));
    glBegin(1);
    Colored::myglVertex2d
              (&this->super_Colored,
               (this->super_Colored).shape_scale_ * -x + (this->super_Colored).x_,
               (this->super_Colored).shape_scale_ * y + (this->super_Colored).y_);
    Colored::myglVertex2d
              (&this->super_Colored,
               (this->super_Colored).shape_scale_ * x + (this->super_Colored).x_,
               (this->super_Colored).shape_scale_ * y + (this->super_Colored).y_);
    glEnd();
  }
  return;
}

Assistant:

void ColorCircle::showUp(){
    if(state_ > 0){
        
        double y_hp = (hp_ / hp_max_) * 2 * r_ - r_;
        double x_hp2 = sqrt(r_ * r_ - y_hp * y_hp);
        double x_hp1 = - x_hp2;
        
        double agl1 = myAtan2(y_hp, x_hp1);
        double agl2 = myAtan2(y_hp, x_hp2);
        if(agl1 > agl2){
            agl2 = agl2 + 360;
        }
        
        glColor3ub(rgb_[0], rgb_[1], rgb_[2]);
        glBegin(GL_POLYGON);
        for(double agl = agl1; agl <= agl2; agl += 360 / ((double)shape_n_) )
        {
            double yy = y_ + shape_scale_ * r_ * sin( agl * DEG2RAD );
            double xx = x_ + shape_scale_ * r_ * cos( agl * DEG2RAD );
            myglVertex2d(xx,yy);
        }
        myglVertex2d(x_ + shape_scale_ * x_hp2, y_ + shape_scale_ * y_hp);
        glEnd();
        
        glColor3ub(0, 0, 0);
        glLineWidth((float)line_width_);
        glBegin(GL_LINES);
        myglVertex2d(x_ + shape_scale_ * x_hp1, y_ + shape_scale_ * y_hp);
        myglVertex2d(x_ + shape_scale_ * x_hp2, y_ + shape_scale_ * y_hp);
        glEnd();
    }
}